

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5SnippetScore(Fts5ExtensionApi *pApi,Fts5Context *pFts,int nDocsize,uchar *aSeen,int iCol,
                    int iPos,int nToken,int *pnScore,int *piPos)

{
  int iVar1;
  int iVar2;
  long local_68;
  sqlite3_int64 iAdj;
  sqlite3_int64 iEnd;
  int local_50;
  int iLast;
  int nScore;
  int nInst;
  int iFirst;
  int iOff;
  int ic;
  int ip;
  int i;
  int rc;
  int iPos_local;
  int iCol_local;
  uchar *aSeen_local;
  Fts5Context *pFStack_18;
  int nDocsize_local;
  Fts5Context *pFts_local;
  Fts5ExtensionApi *pApi_local;
  
  iOff = 0;
  iFirst = 0;
  nInst = 0;
  nScore = -1;
  local_50 = 0;
  iEnd._4_4_ = 0;
  i = iPos;
  rc = iCol;
  _iPos_local = aSeen;
  aSeen_local._4_4_ = nDocsize;
  pFStack_18 = pFts;
  pFts_local = (Fts5Context *)pApi;
  ip = (*pApi->xInstCount)(pFts,&iLast);
  for (ic = 0; ic < iLast && ip == 0; ic = ic + 1) {
    ip = (**(code **)(pFts_local + 0x48))(pFStack_18,ic,&iOff,&iFirst,&nInst);
    iVar1 = nInst;
    if ((((ip == 0) && (iFirst == rc)) && (i <= nInst)) && ((long)nInst < (long)iPos + (long)nToken)
       ) {
      iVar2 = 1000;
      if (_iPos_local[iOff] != '\0') {
        iVar2 = 1;
      }
      local_50 = iVar2 + local_50;
      _iPos_local[iOff] = '\x01';
      if (nScore < 0) {
        nScore = nInst;
      }
      iVar2 = (**(code **)(pFts_local + 0x38))(pFStack_18,iOff);
      iEnd._4_4_ = iVar1 + iVar2;
    }
  }
  *pnScore = local_50;
  if (piPos != (int *)0x0) {
    local_68 = (long)(nScore - (nToken - (iEnd._4_4_ - nScore)) / 2);
    if ((long)aSeen_local._4_4_ < local_68 + nToken) {
      local_68 = (long)(aSeen_local._4_4_ - nToken);
    }
    if (local_68 < 0) {
      local_68 = 0;
    }
    *piPos = (int)local_68;
  }
  return ip;
}

Assistant:

static int fts5SnippetScore(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  int nDocsize,                   /* Size of column in tokens */
  unsigned char *aSeen,           /* Array with one element per query phrase */
  int iCol,                       /* Column to score */
  int iPos,                       /* Starting offset to score */
  int nToken,                     /* Max tokens per snippet */
  int *pnScore,                   /* OUT: Score */
  int *piPos                      /* OUT: Adjusted offset */
){
  int rc;
  int i;
  int ip = 0;
  int ic = 0;
  int iOff = 0;
  int iFirst = -1;
  int nInst;
  int nScore = 0;
  int iLast = 0;
  sqlite3_int64 iEnd = (sqlite3_int64)iPos + nToken;

  rc = pApi->xInstCount(pFts, &nInst);
  for(i=0; i<nInst && rc==SQLITE_OK; i++){
    rc = pApi->xInst(pFts, i, &ip, &ic, &iOff);
    if( rc==SQLITE_OK && ic==iCol && iOff>=iPos && iOff<iEnd ){
      nScore += (aSeen[ip] ? 1 : 1000);
      aSeen[ip] = 1;
      if( iFirst<0 ) iFirst = iOff;
      iLast = iOff + pApi->xPhraseSize(pFts, ip);
    }
  }

  *pnScore = nScore;
  if( piPos ){
    sqlite3_int64 iAdj = iFirst - (nToken - (iLast-iFirst)) / 2;
    if( (iAdj+nToken)>nDocsize ) iAdj = nDocsize - nToken;
    if( iAdj<0 ) iAdj = 0;
    *piPos = (int)iAdj;
  }

  return rc;
}